

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O1

db_bit * __thiscall lan::db::read_value_bit(db *this,string *content,bool in_array)

{
  char cVar1;
  int iVar2;
  db_bit *pdVar3;
  logic_error *this_00;
  long *plVar4;
  size_type *psVar5;
  undefined7 in_register_00000011;
  char *this_01;
  _Alloc_hider _Var6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  string name;
  string local_110;
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_e8 = 0;
  local_e0 = 0;
  local_f0 = &local_e0;
  if ((int)CONCAT71(in_register_00000011,in_array) == 0) {
    pop_next(&local_70,(db *)content,content);
    this_01 = (char *)&local_70;
    lVar8 = std::__cxx11::string::operator=((string *)&local_f0,(string *)this_01);
    bVar9 = *(long *)(lVar8 + 8) == 0;
    bVar10 = !bVar9;
    if (bVar9) {
      bVar9 = true;
    }
    else {
      pop_next(&local_50,(db *)this_01,content);
      this_01 = "=";
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      bVar9 = iVar2 != 0;
      bVar10 = true;
    }
  }
  else {
    bVar10 = false;
    bVar9 = false;
    this_01 = (char *)content;
  }
  if ((bVar10) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    this_01 = (char *)(local_50.field_2._M_allocated_capacity + 1);
    operator_delete(local_50._M_dataplus._M_p,(ulong)this_01);
  }
  if ((!in_array) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    this_01 = (char *)(local_70.field_2._M_allocated_capacity + 1);
    operator_delete(local_70._M_dataplus._M_p,(ulong)this_01);
  }
  if (bVar9) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_d0,"LANDB (pull_error): unable read value bit <",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
    local_110._M_dataplus._M_p = (pointer)*plVar4;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)local_110._M_dataplus._M_p == psVar5) {
      local_110.field_2._M_allocated_capacity = *psVar5;
      local_110.field_2._8_8_ = plVar4[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar5;
    }
    local_110._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_110);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  pop_next(&local_110,(db *)this_01,content);
  cVar1 = *local_110._M_dataplus._M_p;
  if (cVar1 == '\0') {
    bVar10 = false;
  }
  else {
    pop_next(&local_d0,(db *)this_01,content);
    iVar2 = std::__cxx11::string::compare((char *)&local_d0);
    bVar10 = iVar2 == 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (bVar10) {
    iVar2 = tolower((int)cVar1);
    lVar8 = 0;
    do {
      if ((char)iVar2 == (&db_bit_table)[lVar8]) goto LAB_001058a7;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0xb);
    lVar8 = 8;
LAB_001058a7:
    if ((db_bit_type)lVar8 == Array) {
      paVar7 = &local_90.field_2;
      local_90._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_f0,local_f0 + local_e8);
      pdVar3 = read_array_bit(this,&local_90,content);
      _Var6._M_p = local_90._M_dataplus._M_p;
    }
    else {
      paVar7 = &local_b0.field_2;
      local_b0._M_dataplus._M_p = (pointer)paVar7;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_f0,local_f0 + local_e8);
      pdVar3 = read_var_bit(this,&local_b0,(db_bit_type)lVar8,content);
      _Var6._M_p = local_b0._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p != paVar7) {
      operator_delete(_Var6._M_p,paVar7->_M_allocated_capacity + 1);
    }
  }
  else {
    pdVar3 = (db_bit *)0x0;
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
  }
  return pdVar3;
}

Assistant:

lan::db_bit * db::read_value_bit(std::string & content, bool in_array){
            std::string name;
            char c_type;
            db_bit_type type = Unsafe;
            lan::db_bit * bit = nullptr;
            if(!in_array and !((name = pop_next(content)).length() and (pop_next(content) == "="))){
                throw lan::errors::pull_error ("LANDB (pull_error): unable read value bit <" + bit->key + ">, invalid sintax.");
            } if( (c_type = pop_next(content)[0]) and (pop_next(content) == ":")){
                type = convert_to_bit_type(c_type);
                switch(type){
                    case Array: bit = read_array_bit(name, content); break;
                    default: bit = read_var_bit(name, type, content); break;
                } 
            } return bit;
        }